

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

TypeBase *
CheckPreviousTypeDefinition
          (ExpressionContext *ctx,SynBase *source,ModuleContext *moduleCtx,char *symbols,
          ExternTypeInfo *type,TypeClass **forwardDeclaration)

{
  uint uVar1;
  ModuleData *pMVar2;
  ModuleData *pMVar3;
  char *pcVar4;
  char *pcVar5;
  TypeClass *pTVar6;
  TypeClass *pTVar7;
  byte bVar8;
  
  pTVar6 = (TypeClass *)anon_unknown.dwarf_94284::LookupTypeByName(ctx,type->nameHash);
  if (pTVar6 == (TypeClass *)0x0) {
    return (TypeBase *)0x0;
  }
  uVar1 = (pTVar6->super_TypeStruct).super_TypeBase.typeID;
  pTVar7 = (TypeClass *)0x0;
  if (uVar1 == 0x18) {
    pTVar7 = pTVar6;
  }
  if (((type->definitionModule == 0) &&
      (pMVar2 = (pTVar6->super_TypeStruct).super_TypeBase.importModule, pMVar2 != (ModuleData *)0x0)
      ) && (pMVar3 = moduleCtx->data, pMVar3->bytecode != pMVar2->bytecode)) {
    if (((pTVar7 != (TypeClass *)0x0) && ((pTVar7->generics).head == (MatchData *)0x0)) &&
       (pTVar7->completed == true)) {
      if (((type->typeFlags & 0x10) != 0) || (bVar8 = 1, uVar1 == 0x16)) {
LAB_00165536:
        pcVar4 = (pMVar3->name).begin;
        pcVar5 = (pMVar2->name).begin;
        anon_unknown.dwarf_94284::Stop
                  (ctx,source,
                   "ERROR: type \'%s\' in module \'%.*s\' is already defined in module \'%.*s\'",
                   symbols + type->offsetToName,
                   (ulong)(uint)(*(int *)&(pMVar3->name).end - (int)pcVar4),pcVar4,
                   (ulong)(uint)(*(int *)&(pMVar2->name).end - (int)pcVar5),pcVar5);
      }
      goto LAB_001654c7;
    }
    if (uVar1 == 0x16) goto LAB_00165536;
  }
  if (pTVar7 == (TypeClass *)0x0) {
    return (TypeBase *)pTVar6;
  }
  bVar8 = pTVar7->completed;
LAB_001654c7:
  if ((bVar8 & 1) != 0) {
    return (TypeBase *)pTVar6;
  }
  if ((type->typeFlags & 0x10) != 0) {
    if (forwardDeclaration != (TypeClass **)0x0) {
      *forwardDeclaration = pTVar7;
    }
    return (TypeBase *)0x0;
  }
  return (TypeBase *)pTVar6;
}

Assistant:

TypeBase* CheckPreviousTypeDefinition(ExpressionContext &ctx, SynBase *source, ModuleContext &moduleCtx, char *symbols, ExternTypeInfo &type, TypeClass **forwardDeclaration)
{
	if(TypeBase *prevType = LookupTypeByName(ctx, type.nameHash))
	{
		TypeClass *prevTypeClass = getType<TypeClass>(prevType);

		if(type.definitionModule == 0 && prevType->importModule && moduleCtx.data->bytecode != prevType->importModule->bytecode)
		{
			bool duplicate = isType<TypeGenericClassProto>(prevType);

			if(prevTypeClass && prevTypeClass->generics.empty() && prevTypeClass->completed && (type.typeFlags & ExternTypeInfo::TYPE_IS_COMPLETED) != 0)
				duplicate = true;

			if(duplicate)
				Stop(ctx, source, "ERROR: type '%s' in module '%.*s' is already defined in module '%.*s'", symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name), FMT_ISTR(prevType->importModule->name));
		}

		if(prevTypeClass && !prevTypeClass->completed && (type.typeFlags & ExternTypeInfo::TYPE_IS_COMPLETED) != 0)
		{
			if(forwardDeclaration)
				*forwardDeclaration = prevTypeClass;
		}
		else
		{
			return prevType;
		}
	}

	return NULL;
}